

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O2

string_t duckdb::SubstringEmptyString(Vector *result)

{
  idx_t in_RDX;
  string_t result_string;
  anon_union_16_2_67f50693_for_value local_18;
  
  local_18.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString((StringVector *)result,(Vector *)0x0,in_RDX);
  string_t::Finalize((string_t *)&local_18.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_18.pointer;
}

Assistant:

string_t SubstringEmptyString(Vector &result) {
	auto result_string = StringVector::EmptyString(result, 0);
	result_string.Finalize();
	return result_string;
}